

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char16_t * u16tou16_path(char16_t *source,char16_t *dest)

{
  long lVar1;
  char16_t *pcVar2;
  char16_t cVar3;
  char16_t *p1;
  long lVar4;
  
  if (source == (char16_t *)0x0 || dest == (char16_t *)0x0) {
    g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
    return (char16_t *)0x0;
  }
  pcVar2 = dest;
  cVar3 = *source;
  if (cVar3 != 0) {
    lVar4 = 0;
    do {
      lVar1 = lVar4 + 1;
      lVar4 = lVar4 + 1;
    } while (source[lVar1] != 0);
    if (0x103 < (int)lVar4) {
      g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
      return (char16_t *)0x0;
    }
  }
  do {
    source = source + (cVar3 != 0);
    *dest = cVar3;
    dest = dest + 1;
    cVar3 = *source;
  } while (cVar3 != 0);
  return pcVar2;
}

Assistant:

char16_t *u16tou16_path(const char16_t *source, char16_t *dest)
{
	if (dest == NULL || source == NULL)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	int size = strlenU16(source);
	if (size >= MAX_PATH)
	{
		g_lastError = OPENJTALKERROR_CHARSET_CONVERTING_ERROR;
		return NULL;
	}
	return strcpyU16(dest, source);
}